

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liana.c
# Opt level: O0

int mk_liana_send_file(mk_plugin *plugin,int socket_fd,int file_fd,off_t *file_offset,
                      size_t file_count)

{
  ssize_t sVar1;
  ssize_t ret;
  size_t file_count_local;
  off_t *file_offset_local;
  int file_fd_local;
  int socket_fd_local;
  mk_plugin *plugin_local;
  
  sVar1 = sendfile(socket_fd,file_fd,file_offset,file_count);
  if (sVar1 == -1) {
    __errno_location();
  }
  return (int)sVar1;
}

Assistant:

int mk_liana_send_file(struct mk_plugin *plugin, int socket_fd, int file_fd, off_t *file_offset,
                       size_t file_count)
{
    ssize_t ret = -1;

    (void) plugin;

#if defined (__linux__)
    ret = sendfile(socket_fd, file_fd, file_offset, file_count);
    if (ret == -1 && errno != EAGAIN) {
        PLUGIN_TRACE("[FD %i] error from sendfile(): %s",
                     socket_fd, strerror(errno));
    }
    return ret;
#elif defined (__APPLE__)
    off_t offset = *file_offset;
    off_t len = (off_t) file_count;

    ret = sendfile(file_fd, socket_fd, offset, &len, NULL, 0);
    if (ret == -1 && errno != EAGAIN) {
        PLUGIN_TRACE("[FD %i] error from sendfile(): %s",
                     socket_fd, strerror(errno));
    }
    else if (len > 0) {
        *file_offset += len;
        return len;
    }
    return ret;
#elif defined (__FreeBSD__)
    off_t offset = *file_offset;
    off_t len = (off_t) file_count;

    ret = sendfile(file_fd, socket_fd, offset, len, NULL, 0, 0);
    if (ret == -1 && errno != EAGAIN) {
        PLUGIN_TRACE("[FD %i] error from sendfile(): %s",
                     socket_fd, strerror(errno));
    }
    else if (len > 0) {
        *file_offset += len;
        return len;
    }
    return ret;
#else
    #pragma message ("This is a terrible sendfile \"implementation\" and just a crutch")

    ssize_t bytes_written = 0;
    ssize_t to_be_sent = -1;
    ssize_t send_ret = -1;
    uint8_t temporary_buffer[1024];

    if (NULL != file_offset) {
        lseek(file_fd, *file_offset, SEEK_SET);
    }

    while (1) {
        memset(temporary_buffer, 0, sizeof(temporary_buffer));

        ret = read(file_fd, temporary_buffer, sizeof(temporary_buffer));

        if (0 == ret)
        {
            return bytes_written;
        }
        else if (0 > ret)
        {
            return -1;
        }
        else if (0 < ret)
        {
            to_be_sent = ret;

            while (to_be_sent > 0)
            {
                send_ret = send(file_fd, &temporary_buffer[ret - to_be_sent], to_be_sent, 0);

                if (-1 == send_ret)
                {
                    if (EAGAIN != errno &&
                        EWOULDBLOCK != errno)
                    {
                        return -1;
                    }
                }
                else
                {
                    bytes_written += send_ret;
                    to_be_sent -= send_ret;
                }
            }
        }
    }
#endif
}